

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void ungroup_general_undo_redo(Am_Object *command_obj,bool selective)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value_List *this;
  Am_Object *this_00;
  Am_Object group;
  Am_Value_List new_selected_objs;
  Am_Object selection_widget;
  Am_Value_List sub_groups;
  Am_Object sub_group;
  Am_Value_List places;
  Am_Object local_160;
  Am_Value_List local_158;
  Am_Object local_148;
  Am_Value_List local_140;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Value_List local_d0;
  Am_Value_List local_c0;
  Am_Value_List local_b0;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Object local_88;
  Am_Value_List local_80;
  Am_Value_List local_70;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  Am_Value_List local_30;
  
  local_160.data = (Am_Object_Data *)0x0;
  local_d8.data = (Am_Object_Data *)0x0;
  local_148.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_140);
  Am_Value_List::Am_Value_List(&local_d0);
  Am_Object::Am_Object(&local_e0,command_obj);
  Am_Get_Selection_Widget_For_Command((Am_Object *)&local_158);
  Am_Object::operator=(&local_148,(Am_Object *)&local_158);
  Am_Object::~Am_Object((Am_Object *)&local_158);
  Am_Object::~Am_Object(&local_e0);
  pAVar2 = Am_Object::Get(command_obj,0x171,0);
  Am_Object::operator=(&local_160,pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x16d,0);
  Am_Value_List::operator=(&local_140,pAVar2);
  if (!selective) {
    pAVar2 = Am_Object::Get(command_obj,0x1e4,0);
    Am_Value_List::operator=(&local_d0,pAVar2);
  }
  pAVar2 = Am_Object::Get(command_obj,0x16f,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    if (selective) {
      Am_Error("** Shouldn\'t be possible to redo if selective");
    }
    Am_Value_List::Am_Value_List(&local_50,&local_140);
    Am_Object::Am_Object(&local_e8,&local_160);
    in_or_out_of_sub_groups(&local_50,&local_e8,false,false);
    Am_Object::~Am_Object(&local_e8);
    Am_Value_List::~Am_Value_List(&local_50);
    Am_Value_List::Am_Value_List(&local_60,&local_140);
    Am_Object::Am_Object(&local_f0,&local_160);
    Am_Object::Am_Object(&local_f8,&Am_No_Object);
    Am_Object::Am_Object(&local_100,&Am_No_Object);
    remove_and_add_objects(&local_60,&local_f0,&local_f8,&local_100);
    Am_Object::~Am_Object(&local_100);
    Am_Object::~Am_Object(&local_f8);
    Am_Object::~Am_Object(&local_f0);
    Am_Value_List::~Am_Value_List(&local_60);
    Am_Value_List::Am_Value_List(&local_158);
    pAVar2 = Am_Object::Get(command_obj,0x169,0);
    Am_Value_List::operator=(&local_158,pAVar2);
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_158);
    Am_Object::Set(&local_148,0x169,pAVar3,0);
  }
  else {
    if (selective) {
      Am_Object::Am_Object(&local_110,&local_160);
      Am_Value_List::Am_Value_List(&local_98,&local_140);
      Am_Put_Objects_Into_Group(&local_110,&local_98);
      Am_Value_List::~Am_Value_List(&local_98);
      Am_Object::~Am_Object(&local_110);
      this = &local_40;
      Am_Value_List::Am_Value_List(this,&local_140);
      this_00 = &local_a0;
      Am_Object::Am_Object(this_00,&local_160);
      in_or_out_of_sub_groups(this,this_00,true,true);
    }
    else {
      Am_Object::Am_Object(&local_108,&local_160);
      Am_Value_List::Am_Value_List(&local_70,&local_140);
      Am_Value_List::Am_Value_List(&local_80,&local_d0);
      Am_Put_Objects_Back_In_Place(&local_108,&local_70,&local_80,true);
      Am_Value_List::~Am_Value_List(&local_80);
      Am_Value_List::~Am_Value_List(&local_70);
      Am_Object::~Am_Object(&local_108);
      this = &local_30;
      Am_Value_List::Am_Value_List(this,&local_140);
      this_00 = &local_88;
      Am_Object::Am_Object(this_00,&local_160);
      in_or_out_of_sub_groups(this,this_00,true,false);
    }
    Am_Object::~Am_Object(this_00);
    Am_Value_List::~Am_Value_List(this);
    Am_Value_List::Am_Value_List(&local_b0,&local_140);
    Am_Object::Am_Object(&local_118,&local_160);
    in_or_out_of_sub_groups(&local_b0,&local_118,false,false);
    Am_Object::~Am_Object(&local_118);
    Am_Value_List::~Am_Value_List(&local_b0);
    Am_Value_List::Am_Value_List(&local_c0,&local_140);
    Am_Object::Am_Object(&local_120,&local_160);
    Am_Object::Am_Object(&local_128,&Am_No_Object);
    Am_Object::Am_Object(&local_130,&Am_No_Object);
    remove_and_add_objects(&local_c0,&local_120,&local_128,&local_130);
    Am_Object::~Am_Object(&local_130);
    Am_Object::~Am_Object(&local_128);
    Am_Object::~Am_Object(&local_120);
    Am_Value_List::~Am_Value_List(&local_c0);
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_140);
    Am_Object::Set(&local_148,0x169,pAVar3,0);
    Am_Value_List::Am_Value_List(&local_158);
    pAVar2 = Am_Object::Get(command_obj,0x169,0);
    Am_Value_List::operator=(&local_158,pAVar2);
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_158);
    Am_Object::Set(&local_148,0x169,pAVar3,0);
  }
  Am_Value_List::~Am_Value_List(&local_158);
  Am_Object::Set(command_obj,0x16f,!bVar1,0);
  Am_Value_List::~Am_Value_List(&local_d0);
  Am_Value_List::~Am_Value_List(&local_140);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_160);
  return;
}

Assistant:

void
ungroup_general_undo_redo(Am_Object command_obj, bool selective)
{
  Am_Object group, sub_group, selection_widget;
  Am_Value_List sub_groups, places;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  group = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
  sub_groups = command_obj.Get(Am_OBJECT_MODIFIED);
  if (!selective)
    places = command_obj.Get(Am_OBJECT_MODIFIED_PLACES);
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);

  if (currently_undone) { // then redo = ungroup objects again.
                          // Places should still be valid
    if (selective)
      Am_Error("** Shouldn't be possible to redo if selective");
    //remove objects from sub_groups
    in_or_out_of_sub_groups(sub_groups, group, false, false);
    //remove the sub_groups from group
    remove_and_add_objects(sub_groups, group, Am_No_Object);

    //set the selection
    Am_Value_List new_selected_objs;
    new_selected_objs = command_obj.Get(Am_VALUE);
    selection_widget.Set(Am_VALUE, new_selected_objs);
  } else { // undo = restore groups and put objects into them
    if (!selective) {
      Am_Put_Objects_Back_In_Place(group, sub_groups, places, true);
      //move objects back into the groups
      in_or_out_of_sub_groups(sub_groups, group, true, false);
    } else {
      Am_Put_Objects_Into_Group(group, sub_groups);
      in_or_out_of_sub_groups(sub_groups, group, true, true);
    }
    //remove objects from sub_groups
    in_or_out_of_sub_groups(sub_groups, group, false, false);
    //remove the sub_groups from group
    remove_and_add_objects(sub_groups, group, Am_No_Object);

    //now set the selection.
    selection_widget.Set(Am_VALUE, sub_groups);
    //set the selection
    Am_Value_List new_selected_objs;
    new_selected_objs = command_obj.Get(Am_VALUE);
    selection_widget.Set(Am_VALUE, new_selected_objs);
  }
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}